

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O2

void __thiscall
cmCTestSVN::LogParser::LogParser(LogParser *this,cmCTestSVN *svn,char *prefix,SVNInfo *svninfo)

{
  cmProcessTools::OutputLogger::OutputLogger
            (&this->super_OutputLogger,(svn->super_cmCTestGlobalVC).super_cmCTestVC.Log,prefix);
  cmXMLParser::cmXMLParser(&this->super_cmXMLParser);
  (this->super_OutputLogger).super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LogParser_0066aac0;
  (this->super_cmXMLParser)._vptr_cmXMLParser = (_func_int **)&PTR__LogParser_0066ab10;
  this->SVN = svn;
  this->SVNRepo = svninfo;
  cmCTestVC::Revision::Revision(&(this->Rev).super_Revision);
  (this->Changes).
  super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Changes).
  super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Changes).
  super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->CurChange).Action = '?';
  (this->CurChange).Path._M_dataplus._M_p = (pointer)&(this->CurChange).Path.field_2;
  (this->CurChange).Path._M_string_length = 0;
  (this->CurChange).Path.field_2._M_local_buf[0] = '\0';
  (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (*(this->super_cmXMLParser)._vptr_cmXMLParser[4])(&this->super_cmXMLParser);
  return;
}

Assistant:

LogParser(cmCTestSVN* svn, const char* prefix, SVNInfo& svninfo):
    OutputLogger(svn->Log, prefix), SVN(svn), SVNRepo(svninfo)
  { this->InitializeParser(); }